

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fft4g.c
# Opt level: O1

void cftfsub(int n,double *a,double *w)

{
  uint uVar1;
  ulong uVar2;
  uint l;
  ulong uVar3;
  uint uVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  
  uVar4 = 2;
  if (8 < n) {
    cft1st(n,a,w);
    uVar4 = 8;
    if (0x20 < n) {
      uVar1 = 0x20;
      l = 8;
      do {
        uVar4 = uVar1;
        cftmdl(n,l,a,w);
        uVar1 = uVar4 * 4;
        l = uVar4;
      } while ((int)(uVar4 * 4) < n);
    }
  }
  if (uVar4 * 4 == n) {
    if (0 < (int)uVar4) {
      uVar2 = (ulong)uVar4;
      uVar3 = 0;
      do {
        dVar9 = a[uVar3] + a[uVar2 + uVar3];
        dVar10 = a[uVar3 + 1] + a[uVar2 + uVar3 + 1];
        dVar6 = a[uVar3] - a[uVar2 + uVar3];
        dVar5 = a[uVar3 + 1] - a[uVar2 + uVar3 + 1];
        dVar11 = a[uVar2 * 2 + uVar3] + a[uVar2 * 3 + uVar3];
        dVar12 = a[uVar2 * 2 + uVar3 + 1] + a[uVar2 * 3 + uVar3 + 1];
        dVar7 = a[uVar2 * 2 + uVar3] - a[uVar2 * 3 + uVar3];
        dVar8 = a[uVar2 * 2 + uVar3 + 1] - a[uVar2 * 3 + uVar3 + 1];
        a[uVar3] = dVar9 + dVar11;
        a[uVar3 + 1] = dVar10 + dVar12;
        a[uVar2 * 2 + uVar3] = dVar9 - dVar11;
        a[uVar2 * 2 + uVar3 + 1] = dVar10 - dVar12;
        a[uVar2 + uVar3] = dVar6 - dVar8;
        a[uVar2 + uVar3 + 1] = dVar5 + dVar7;
        a[uVar2 * 3 + uVar3] = dVar8 + dVar6;
        a[uVar2 * 3 + uVar3 + 1] = dVar5 - dVar7;
        uVar3 = uVar3 + 2;
      } while (uVar3 < uVar2);
    }
  }
  else if (0 < (int)uVar4) {
    uVar2 = (ulong)uVar4;
    uVar3 = 0;
    do {
      dVar5 = a[uVar2 + uVar3];
      dVar6 = a[uVar3];
      dVar7 = a[uVar3 + 1];
      dVar8 = a[uVar2 + uVar3 + 1];
      a[uVar3] = dVar6 + dVar5;
      a[uVar3 + 1] = dVar7 + a[uVar2 + uVar3 + 1];
      a[uVar2 + uVar3] = dVar6 - dVar5;
      a[uVar2 + uVar3 + 1] = dVar7 - dVar8;
      uVar3 = uVar3 + 2;
    } while (uVar3 < uVar2);
  }
  return;
}

Assistant:

void cftfsub(int n, double *a, double *w)
{
    void cft1st(int n, double *a, double *w);
    void cftmdl(int n, int l, double *a, double *w);
    int j, j1, j2, j3, l;
    double x0r, x0i, x1r, x1i, x2r, x2i, x3r, x3i;
    
    l = 2;
    if (n > 8) {
        cft1st(n, a, w);
        l = 8;
        while ((l << 2) < n) {
            cftmdl(n, l, a, w);
            l <<= 2;
        }
    }
    if ((l << 2) == n) {
        for (j = 0; j < l; j += 2) {
            j1 = j + l;
            j2 = j1 + l;
            j3 = j2 + l;
            x0r = a[j] + a[j1];
            x0i = a[j + 1] + a[j1 + 1];
            x1r = a[j] - a[j1];
            x1i = a[j + 1] - a[j1 + 1];
            x2r = a[j2] + a[j3];
            x2i = a[j2 + 1] + a[j3 + 1];
            x3r = a[j2] - a[j3];
            x3i = a[j2 + 1] - a[j3 + 1];
            a[j] = x0r + x2r;
            a[j + 1] = x0i + x2i;
            a[j2] = x0r - x2r;
            a[j2 + 1] = x0i - x2i;
            a[j1] = x1r - x3i;
            a[j1 + 1] = x1i + x3r;
            a[j3] = x1r + x3i;
            a[j3 + 1] = x1i - x3r;
        }
    } else {
        for (j = 0; j < l; j += 2) {
            j1 = j + l;
            x0r = a[j] - a[j1];
            x0i = a[j + 1] - a[j1 + 1];
            a[j] += a[j1];
            a[j + 1] += a[j1 + 1];
            a[j1] = x0r;
            a[j1 + 1] = x0i;
        }
    }
}